

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall
clipp::detail::
formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::write_spaces(formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,int n)

{
  ostream *poVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (0 < n) {
    poVar1 = (ostream *)this->os_;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct((ulong)local_40,(char)n);
    std::operator<<(poVar1,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    this->curCol_ = this->curCol_ + n;
  }
  return;
}

Assistant:

void write_spaces(int n) {
        if(n < 1) return;
        os_ << string_type(size_type(n), ' ');
        curCol_ += n;
    }